

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer *ppTVar2;
  pointer *ppDVar3;
  pointer *ppVVar4;
  ostringstream *this_00;
  pointer *ppiVar5;
  ContextInfo *pCVar6;
  TestLog *pTVar7;
  iterator __position;
  iterator __position_00;
  iterator iVar8;
  pointer pPVar9;
  uint uVar10;
  pointer pVVar11;
  bool bVar12;
  int i;
  int iVar13;
  deUint32 dVar14;
  CaseType CVar15;
  uint uVar16;
  undefined4 uVar17;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  long *plVar18;
  size_t sVar19;
  Texture2D *this_01;
  TextureCube *this_02;
  Texture2DArray *this_03;
  Texture3D *this_04;
  long lVar20;
  pointer ppTVar21;
  _Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *p_Var22;
  MultiTexShader *this_05;
  uint depth;
  uint uVar23;
  long *plVar24;
  pointer pVVar25;
  undefined1 *puVar26;
  long lVar27;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  int iVar28;
  pointer pDVar29;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  uint width;
  ulong uVar30;
  int levelNdx;
  uint uVar31;
  float fVar32;
  vector<glu::DataType,_std::allocator<glu::DataType>_> samplerTypes;
  ulong local_478;
  GLenum type;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texScales;
  Vector<float,_4> res_3;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texBiases;
  TextureFormat texFormat;
  vector<int,_std::allocator<int>_> num2dArrayLayers;
  GLenum type_1;
  undefined4 uStack_3cc;
  long local_3c8;
  pointer local_3c0 [2];
  uint local_3b0;
  uint local_3ac;
  Vector<float,_4> res;
  long local_398 [2];
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>>
  *local_388;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_380;
  ulong local_378;
  ulong local_370;
  vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>> *local_368;
  vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>> *local_360;
  vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *local_358;
  vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *local_350;
  Vector<float,_4> res_2;
  RGBA local_338 [4];
  TextureFormatInfo fmtInfo;
  ios_base local_2b0 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  ios_base local_138 [264];
  
  iVar13 = this->m_numUnitsParam;
  if (iVar13 < 1) {
    pCVar6 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar13 = (*pCVar6->_vptr_ContextInfo[2])(pCVar6,0x8872);
  }
  this->m_numUnits = iVar13;
  pTVar7 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&rnd.m_rnd,this->m_randSeed);
  fVar32 = deRandom_getFloat(&rnd.m_rnd);
  iVar13 = this->m_numUnits;
  if (0.7 <= fVar32) {
    dVar14 = deRandom_getUint32(&rnd.m_rnd);
    iVar28 = 1;
    if (1 < iVar13 + -2) {
      iVar28 = iVar13 + -2;
    }
    iVar13 = dVar14 % ((iVar13 - iVar28) + 1U) + iVar28;
  }
  this->m_numTextures = iVar13;
  this_00 = (ostringstream *)(fmtInfo.valueMin.m_data + 2);
  fmtInfo.valueMin.m_data._0_8_ = pTVar7;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&unitTypes);
  std::ostream::operator<<(&unitTypes,this->m_numUnits);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&unitTypes);
  std::ios_base::~ios_base(local_138);
  plVar18 = (long *)std::__cxx11::string::replace((ulong)&res,0,(char *)0x0,0x1c07d61);
  ppiVar5 = &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar24 = plVar18 + 2;
  if ((long *)*plVar18 == plVar24) {
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar24;
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppiVar5;
  }
  else {
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar24;
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar18;
  }
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar18[1];
  *plVar18 = (long)plVar24;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&num2dArrayLayers);
  ppDVar3 = &samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pDVar29 = (pointer)(plVar18 + 2);
  if ((pointer)*plVar18 == pDVar29) {
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pDVar29;
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppDVar3;
  }
  else {
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pDVar29;
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar18;
  }
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar18[1];
  *plVar18 = (long)pDVar29;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&unitTypes);
  std::ostream::operator<<(&unitTypes,this->m_numTextures);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&unitTypes);
  std::ios_base::~ios_base(local_138);
  pDVar29 = (pointer)0xf;
  if ((pointer *)
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != ppDVar3) {
    pDVar29 = samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage;
  }
  if (pDVar29 < (pointer)(local_3c8 +
                         (long)samplerTypes.
                               super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                               _M_impl.super__Vector_impl_data._M_finish)) {
    pDVar29 = (pointer)0xf;
    if ((pointer *)CONCAT44(uStack_3cc,type_1) != local_3c0) {
      pDVar29 = local_3c0[0];
    }
    if ((pointer)(local_3c8 +
                 (long)samplerTypes.
                       super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                       super__Vector_impl_data._M_finish) <= pDVar29) {
      plVar18 = (long *)std::__cxx11::string::replace
                                  ((ulong)&type_1,0,(char *)0x0,
                                   (ulong)samplerTypes.
                                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_011a6ac3;
    }
  }
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&samplerTypes,CONCAT44(uStack_3cc,type_1));
LAB_011a6ac3:
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&texBiases.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar25 = (pointer)(plVar18 + 2);
  if ((pointer)*plVar18 == pVVar25) {
    texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar25->m_data;
  }
  else {
    texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar25->m_data;
    texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar18;
  }
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar18[1];
  *plVar18 = (long)pVVar25;
  plVar18[1] = 0;
  *(undefined1 *)pVVar25->m_data = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&texBiases);
  ppVVar4 = &texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar25 = (pointer)(plVar18 + 2);
  if ((pointer)*plVar18 == pVVar25) {
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar25->m_data;
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar4;
  }
  else {
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar25->m_data;
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar18;
  }
  pVVar11 = texScales.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar18[1];
  *plVar18 = (long)pVVar25;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  if (texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(fmtInfo.valueMin.m_data._8_8_ + -0x18));
  }
  else {
    sVar19 = strlen((char *)texScales.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)pVVar11,sVar19);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fmtInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar4) {
    operator_delete(texScales.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(texScales.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if (texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&texBiases.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(texBiases.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(texBiases.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((pointer *)CONCAT44(uStack_3cc,type_1) != local_3c0) {
    operator_delete((pointer *)CONCAT44(uStack_3cc,type_1),(ulong)((long)local_3c0[0] + 1));
  }
  if ((pointer *)
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != ppDVar3) {
    operator_delete(samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)samplerTypes.
                                  super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if ((pointer *)
      num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != ppiVar5) {
    operator_delete(num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((long *)res.m_data._0_8_ != local_398) {
    operator_delete((void *)res.m_data._0_8_,local_398[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_2b0);
  local_380 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_textureTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_380,
             (long)this->m_numTextures);
  local_388 = (vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>>
               *)&this->m_textureParams;
  std::
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve((vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
             *)local_388,(long)this->m_numTextures);
  pvVar1 = &this->m_ndxTexType;
  std::vector<int,_std::allocator<int>_>::reserve(pvVar1,(long)this->m_numTextures);
  if (0 < this->m_numTextures) {
    local_360 = (vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>> *)&this->m_textures3d;
    local_368 = (vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>> *)
                &this->m_textures2dArray;
    local_358 = (vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *)&this->m_texturesCube
    ;
    local_350 = (vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *)&this->m_textures2d;
    local_378 = 0;
    do {
      CVar15 = this->m_caseType;
      if (CVar15 == CASE_MIXED) {
        CVar15 = deRandom_getUint32(&rnd.m_rnd);
        CVar15 = CVar15 & CASE_ONLY_3D;
      }
      if (CVar15 == CASE_ONLY_2D) {
        type = 0xde1;
        uVar30 = 0x80;
      }
      else {
        type = 0x806f;
        if (CVar15 == CASE_ONLY_2D_ARRAY) {
          type = 0x8c1a;
        }
        if (CVar15 == CASE_ONLY_CUBE) {
          type = 0x8513;
        }
        uVar30 = (ulong)((uint)(CVar15 == CASE_ONLY_2D_ARRAY) * 0x20 + 0x20);
        if (CVar15 == CASE_ONLY_CUBE) {
          uVar30 = 0x100;
        }
      }
      uVar31 = (uint)(CVar15 == CASE_ONLY_2D_ARRAY) * 0x20 + 0x20;
      if (CVar15 == CASE_ONLY_CUBE) {
        uVar31 = 0x100;
      }
      if (CVar15 == CASE_ONLY_2D) {
        uVar31 = 0x80;
      }
      depth = 1;
      if (CVar15 == CASE_ONLY_3D) {
        depth = 0x20;
      }
      width = (uint)uVar30;
      uVar23 = width - ((uint)(uVar30 >> 1) & 0x55);
      uVar23 = (uVar23 >> 2 & 0x33333333) + (uVar23 & 0x33333333);
      uVar23 = ((uVar23 >> 4) + uVar23 & 0xf0f0f0f) * 0x1010101 >> 0x18;
      local_370 = 1;
      if (uVar23 < 2) {
        uVar16 = uVar31;
        if (uVar31 < width) {
          uVar16 = width;
        }
        if (uVar16 <= depth) {
          uVar16 = depth;
        }
        uVar10 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        local_370 = (ulong)((uVar10 ^ 0xffffffe0) + 0x21);
      }
      dVar14 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             *(deUint32 *)(s_testSizedInternalFormats + (ulong)(dVar14 % 0x31) * 4))
      ;
      bVar12 = glu::isGLInternalColorFormatFilterable
                         (*(deUint32 *)(s_testSizedInternalFormats + (ulong)(dVar14 % 0x31) * 4));
      dVar14 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(*(undefined4 *)(s_testWrapModes + (ulong)(dVar14 % 3) * 4),
                             (deUint32)
                             texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      dVar14 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             *(undefined4 *)(s_testWrapModes + (ulong)(dVar14 % 3) * 4));
      dVar14 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(*(undefined4 *)(s_testWrapModes + (ulong)(dVar14 % 3) * 4),
                             texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_4_);
      uVar17 = 0x2600;
      if (bVar12) {
        dVar14 = deRandom_getUint32(&rnd.m_rnd);
        uVar17 = (&s_testNonMipmapMinFilters)[dVar14 & 1];
      }
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(uVar17,texScales.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      if (uVar23 < 2) {
        if (bVar12) {
          dVar14 = deRandom_getUint32(&rnd.m_rnd);
          uVar23 = dVar14 % 6;
          puVar26 = s_testMinFilters;
        }
        else {
          dVar14 = deRandom_getUint32(&rnd.m_rnd);
          uVar23 = dVar14 & 1;
          puVar26 = (undefined1 *)&s_testNearestMinFilters;
        }
        uVar17 = *(undefined4 *)((long)puVar26 + (ulong)uVar23 * 4);
      }
      else {
        uVar17 = 0x2600;
        if (bVar12) {
          dVar14 = deRandom_getUint32(&rnd.m_rnd);
          uVar17 = (&s_testNonMipmapMinFilters)[dVar14 & 1];
        }
      }
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,uVar17);
      __position._M_current =
           (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_380,__position,&type);
      }
      else {
        *__position._M_current = type;
        (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (this->m_textureParams).
           super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_textureParams).
          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>>
        ::_M_realloc_insert<deqp::gles3::Functional::TextureUnitCase::TextureParameters_const&>
                  (local_388,__position_00,(TextureParameters *)&texScales);
      }
      else {
        *(pointer *)&(__position_00._M_current)->minFilter =
             texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(pointer *)__position_00._M_current =
             texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)&(__position_00._M_current)->wrapModeT =
             texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppTVar2 = &(this->m_textureParams).
                   super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar2 = *ppTVar2 + 1;
      }
      texFormat = glu::mapGLInternalFormat
                            ((deUint32)
                             texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      if (CVar15 == CASE_ONLY_2D) {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(this->m_textures2d).
                                   super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_textures2d).
                                  super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar8._M_current =
             (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pvVar1,iVar8,(int *)&fmtInfo);
        }
        else {
          *iVar8._M_current = (int)fmtInfo.valueMin.m_data[0];
          (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        this_01 = (Texture2D *)operator_new(0x50);
        tcu::Texture2D::Texture2D(this_01,&texFormat,width,uVar31);
        fmtInfo.valueMin.m_data._0_8_ = this_01;
        std::vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>>::emplace_back<tcu::Texture2D*>
                  (local_350,(Texture2D **)&fmtInfo);
      }
      else if (CVar15 == CASE_ONLY_CUBE) {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(this->m_texturesCube).
                                   super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_texturesCube).
                                  super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar8._M_current =
             (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pvVar1,iVar8,(int *)&fmtInfo);
        }
        else {
          *iVar8._M_current = (int)fmtInfo.valueMin.m_data[0];
          (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        this_02 = (TextureCube *)operator_new(0x168);
        tcu::TextureCube::TextureCube(this_02,&texFormat,width);
        fmtInfo.valueMin.m_data._0_8_ = this_02;
        std::vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>>::
        emplace_back<tcu::TextureCube*>(local_358,(TextureCube **)&fmtInfo);
      }
      else if (CVar15 == CASE_ONLY_2D_ARRAY) {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(this->m_textures2dArray).
                                   super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_textures2dArray).
                                  super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar8._M_current =
             (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pvVar1,iVar8,(int *)&fmtInfo);
        }
        else {
          *iVar8._M_current = (int)fmtInfo.valueMin.m_data[0];
          (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        this_03 = (Texture2DArray *)operator_new(0x58);
        tcu::Texture2DArray::Texture2DArray
                  (this_03,&texFormat,width,uVar31,(uint)(CVar15 == CASE_ONLY_2D_ARRAY) * 3 + 1);
        fmtInfo.valueMin.m_data._0_8_ = this_03;
        std::vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>>::
        emplace_back<tcu::Texture2DArray*>(local_368,(Texture2DArray **)&fmtInfo);
      }
      else {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(this->m_textures3d).
                                   super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_textures3d).
                                  super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar8._M_current =
             (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pvVar1,iVar8,(int *)&fmtInfo);
        }
        else {
          *iVar8._M_current = (int)fmtInfo.valueMin.m_data[0];
          (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        this_04 = (Texture3D *)operator_new(0x58);
        tcu::Texture3D::Texture3D(this_04,&texFormat,width,uVar31,depth);
        fmtInfo.valueMin.m_data._0_8_ = this_04;
        std::vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>>::emplace_back<tcu::Texture3D*>
                  (local_360,(Texture3D **)&fmtInfo);
      }
      tcu::getTextureFormatInfo(&fmtInfo,&texFormat);
      texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)fmtInfo.valueMin.m_data._0_8_;
      texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)fmtInfo.valueMin.m_data._8_8_;
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar20 = 0;
      do {
        *(float *)((long)&samplerTypes.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar20 * 4) =
             fmtInfo.valueMax.m_data[lVar20] - fmtInfo.valueMin.m_data[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      local_478 = 0;
      do {
        dVar14 = deRandom_getUint32(&rnd.m_rnd);
        lVar20 = 0;
        uVar30 = 0;
        do {
          iVar13 = (int)uVar30;
          if (CVar15 == CASE_ONLY_2D) {
            tcu::Texture2D::allocLevel
                      ((this->m_textures2d).
                       super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],iVar13);
          }
          else if (CVar15 == CASE_ONLY_CUBE) {
            tcu::TextureCube::allocLevel
                      ((this->m_texturesCube).
                       super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],(CubeFace)local_478,iVar13);
          }
          else if (CVar15 == CASE_ONLY_2D_ARRAY) {
            tcu::Texture2DArray::allocLevel
                      ((this->m_textures2dArray).
                       super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1],iVar13);
          }
          else {
            tcu::Texture3D::allocLevel
                      ((this->m_textures3d).
                       super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],iVar13);
          }
          uVar31 = 8 >> ((byte)uVar30 & 0x1f);
          if ((int)uVar31 < 2) {
            uVar31 = 1;
          }
          if (CVar15 == CASE_ONLY_2D) {
            ppTVar21 = (pointer)(this->m_textures2d).
                                super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
LAB_011a7421:
            p_Var22 = &(ppTVar21[-1]->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
            ;
          }
          else {
            if (CVar15 != CASE_ONLY_CUBE) {
              if (CVar15 == CASE_ONLY_2D_ARRAY) {
                ppTVar21 = (pointer)(this->m_textures2dArray).
                                    super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                ppTVar21 = (this->m_textures3d).
                           super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
              }
              goto LAB_011a7421;
            }
            p_Var22 = &(this->m_texturesCube).
                       super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]->m_access[local_478].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
            ;
          }
          pPVar9 = (p_Var22->_M_impl).super__Vector_impl_data._M_start;
          unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)&pPVar9[uVar30].super_ConstPixelBufferAccess.m_format;
          lVar27 = 2;
          do {
            *(undefined4 *)
             ((long)&unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar27 * 4) =
                 *(undefined4 *)
                  ((long)(pPVar9->super_ConstPixelBufferAccess).m_size.m_data +
                  lVar27 * 4 + lVar20 + -8);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 5);
          lVar27 = 5;
          do {
            *(undefined4 *)
             ((long)&unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar27 * 4) =
                 *(undefined4 *)
                  ((long)(pPVar9->super_ConstPixelBufferAccess).m_size.m_data +
                  lVar27 * 4 + lVar20 + -8);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 8);
          local_3ac = dVar14 | 0xff000000;
          tcu::RGBA::toVec((RGBA *)&type_1);
          res.m_data[0] = 0.0;
          res.m_data[1] = 0.0;
          res.m_data[2] = 0.0;
          res.m_data[3] = 0.0;
          lVar27 = 0;
          do {
            res.m_data[lVar27] =
                 (float)(&type_1)[lVar27] *
                 *(float *)((long)&samplerTypes.
                                   super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar27 * 4);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 4);
          num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar27 = 0;
          do {
            *(float *)((long)&num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + lVar27 * 4) =
                 res.m_data[lVar27] +
                 *(float *)((long)&texBiases.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar27 * 4);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 4);
          local_3b0 = ~dVar14 | 0xff000000;
          tcu::RGBA::toVec(local_338);
          res_2.m_data[0] = 0.0;
          res_2.m_data[1] = 0.0;
          res_2.m_data[2] = 0.0;
          res_2.m_data[3] = 0.0;
          lVar27 = 0;
          do {
            res_2.m_data[lVar27] =
                 (float)local_338[lVar27].m_value *
                 *(float *)((long)&samplerTypes.
                                   super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar27 * 4);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 4);
          res_3.m_data[0] = 0.0;
          res_3.m_data[1] = 0.0;
          res_3.m_data[2] = 0.0;
          res_3.m_data[3] = 0.0;
          lVar27 = 0;
          do {
            res_3.m_data[lVar27] =
                 res_2.m_data[lVar27] +
                 *(float *)((long)&texBiases.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar27 * 4);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 4);
          tcu::fillWithGrid((PixelBufferAccess *)&unitTypes,uVar31,(Vec4 *)&num2dArrayLayers,&res_3)
          ;
          uVar30 = uVar30 + 1;
          lVar20 = lVar20 + 0x28;
        } while (uVar30 != local_370);
      } while ((CVar15 == CASE_ONLY_CUBE) &&
              (bVar12 = local_478 < 5, local_478 = local_478 + 1, bVar12));
      uVar31 = (int)local_378 + 1;
      local_378 = (ulong)uVar31;
    } while ((int)uVar31 < this->m_numTextures);
  }
  pvVar1 = &this->m_unitTextures;
  std::vector<int,_std::allocator<int>_>::reserve(pvVar1,(long)this->m_numUnits);
  fmtInfo.valueMin.m_data._0_8_ = fmtInfo.valueMin.m_data._0_8_ & 0xffffffff00000000;
  if (0 < this->m_numTextures) {
    fVar32 = 0.0;
    do {
      iVar8._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)pvVar1,iVar8,(int *)&fmtInfo);
      }
      else {
        *iVar8._M_current = (int)fVar32;
        (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar8._M_current + 1;
      }
      fVar32 = (float)((int)fmtInfo.valueMin.m_data[0] + 1);
      fmtInfo.valueMin.m_data[0] = fVar32;
    } while ((int)fVar32 < this->m_numTextures);
  }
  last._M_current =
       (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  first._M_current =
       (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) < this->m_numUnits) {
    do {
      uVar31 = this->m_numTextures;
      dVar14 = deRandom_getUint32(&rnd.m_rnd);
      fVar32 = (float)(dVar14 % uVar31);
      fmtInfo.valueMin.m_data[0] = fVar32;
      iVar8._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar8,(int *)&fmtInfo)
        ;
      }
      else {
        *iVar8._M_current = (int)fVar32;
        (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar8._M_current + 1;
      }
      last._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      first._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    } while ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) < this->m_numUnits)
    ;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,first,last);
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&unitTypes,(long)this->m_numUnits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            (&texScales,(long)this->m_numUnits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            (&texBiases,(long)this->m_numUnits);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::reserve
            (&samplerTypes,(long)this->m_numUnits);
  std::vector<int,_std::allocator<int>_>::reserve(&num2dArrayLayers,(long)this->m_numUnits);
  if (0 < this->m_numUnits) {
    lVar20 = 0;
    do {
      lVar27 = (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar20];
      type_1 = *(GLenum *)(*(long *)local_380 + lVar27 * 4);
      res.m_data._0_8_ = glu::mapGLInternalFormat(*(deUint32 *)(*(long *)local_388 + lVar27 * 0x18))
      ;
      tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&res);
      if (unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&unitTypes,
                   (iterator)
                   unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,&type_1);
      }
      else {
        *unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = type_1;
        unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (type_1 == 0x8c1a) {
        fVar32 = (float)(this->m_textures2dArray).
                        super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar27]]->m_numLayers;
        res_3.m_data[0] = fVar32;
        if (num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&num2dArrayLayers,
                     (iterator)
                     num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&res_3);
        }
        else {
          *num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = (int)fVar32;
          num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&texScales,&fmtInfo.lookupScale);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&texBiases,&fmtInfo.lookupBias);
      if ((int)type_1 < 0x8513) {
        if (type_1 == 0xde1) {
          fVar32 = (float)glu::getSampler2DType((TextureFormat)res.m_data._0_8_);
          res_3.m_data[0] = fVar32;
          if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
            _M_realloc_insert<glu::DataType>
                      (&samplerTypes,
                       (iterator)
                       samplerTypes.
                       super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                       super__Vector_impl_data._M_finish,(DataType *)&res_3);
          }
          else {
LAB_011a79b1:
            *samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
             super__Vector_impl_data._M_finish = (DataType)fVar32;
            samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((float *)samplerTypes.
                                    super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 1);
          }
        }
        else if (type_1 == 0x806f) {
          fVar32 = (float)glu::getSampler3DType((TextureFormat)res.m_data._0_8_);
          res_3.m_data[0] = fVar32;
          if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) goto LAB_011a79b1;
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    (&samplerTypes,
                     (iterator)
                     samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(DataType *)&res_3);
        }
      }
      else if (type_1 == 0x8513) {
        fVar32 = (float)glu::getSamplerCubeType((TextureFormat)res.m_data._0_8_);
        res_3.m_data[0] = fVar32;
        if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_011a79b1;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  (&samplerTypes,
                   (iterator)
                   samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(DataType *)&res_3);
      }
      else if (type_1 == 0x8c1a) {
        fVar32 = (float)glu::getSampler2DArrayType((TextureFormat)res.m_data._0_8_);
        res_3.m_data[0] = fVar32;
        if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_011a79b1;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  (&samplerTypes,
                   (iterator)
                   samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(DataType *)&res_3);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < this->m_numUnits);
  }
  this_05 = (MultiTexShader *)operator_new(0x1d0);
  dVar14 = deRandom_getUint32(&rnd.m_rnd);
  MultiTexShader::MultiTexShader
            (this_05,dVar14,this->m_numUnits,&unitTypes,&samplerTypes,&texScales,&texBiases,
             &num2dArrayLayers);
  this->m_shader = this_05;
  iVar13 = extraout_EAX;
  if (num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar13 = extraout_EAX_00;
  }
  if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)samplerTypes.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)samplerTypes.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar13 = extraout_EAX_01;
  }
  if (texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texBiases.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)texBiases.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)texBiases.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar13 = extraout_EAX_02;
  }
  if (texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texScales.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)texScales.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)texScales.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar13 = extraout_EAX_03;
  }
  if (unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar13 = extraout_EAX_04;
  }
  return iVar13;
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndxTexType.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types, and randomized parameters for every texture.

			TextureParameters	params;

			DE_STATIC_ASSERT(CASE_ONLY_2D == 0 && CASE_MIXED + 1 == CASE_LAST);

			int						texType			= m_caseType == CASE_MIXED ? rnd.getInt(0, (int)CASE_MIXED - 1) : (int)m_caseType;
			bool					is2dTex			= texType == 0;
			bool					isCubeTex		= texType == 1;
			bool					is2dArrayTex	= texType == 2;
			bool					is3dTex			= texType == 3;

			DE_ASSERT(is2dTex || isCubeTex || is2dArrayTex || is3dTex);

			GLenum					type			= is2dTex		? GL_TEXTURE_2D		: isCubeTex ? GL_TEXTURE_CUBE_MAP	: is2dArrayTex ? GL_TEXTURE_2D_ARRAY		: GL_TEXTURE_3D;
			const int				texWidth		= is2dTex		? TEXTURE_WIDTH_2D	: isCubeTex ? TEXTURE_WIDTH_CUBE	: is2dArrayTex ? TEXTURE_WIDTH_2D_ARRAY		: TEXTURE_WIDTH_3D;
			const int				texHeight		= is2dTex		? TEXTURE_HEIGHT_2D	: isCubeTex ? TEXTURE_HEIGHT_CUBE	: is2dArrayTex ? TEXTURE_HEIGHT_2D_ARRAY	: TEXTURE_HEIGHT_3D;

			const int				texDepth		= is3dTex ? TEXTURE_DEPTH_3D : 1;
			const int				texLayers		= is2dArrayTex ? TEXTURE_LAYERS_2D_ARRAY : 1;

			bool					mipmaps			= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight) && deIsPowerOfTwo32(texDepth));
			int						numLevels		= mipmaps ? deLog2Floor32(de::max(de::max(texWidth, texHeight), texDepth))+1 : 1;

			params.internalFormat = s_testSizedInternalFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testSizedInternalFormats) - 1)];

			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(params.internalFormat);

			params.wrapModeS = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeR = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];

			params.magFilter = isFilterable ? s_testMagFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)] : GL_NEAREST;

			if (mipmaps)
				params.minFilter = isFilterable ?
					s_testMinFilters			[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)] :
					s_testNearestMinFilters		[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNearestMinFilters) - 1)];
			else
				params.minFilter = isFilterable ?
					s_testNonMipmapMinFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)] :
					GL_NEAREST;

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			tcu::TextureFormat texFormat = glu::mapGLInternalFormat((deUint32)params.internalFormat);

			if (is2dTex)
			{
				m_ndxTexType.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d texture vector.
				m_textures2d.push_back(new tcu::Texture2D(texFormat, texWidth, texHeight));
			}
			else if (isCubeTex)
			{
				m_ndxTexType.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube texture vector.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(texFormat, texWidth));
			}
			else if (is2dArrayTex)
			{
				m_ndxTexType.push_back((int)m_textures2dArray.size()); // Remember the index this texture has in the 2d array texture vector.
				m_textures2dArray.push_back(new tcu::Texture2DArray(texFormat, texWidth, texHeight, texLayers));
			}
			else
			{
				m_ndxTexType.push_back((int)m_textures3d.size()); // Remember the index this texture has in the 3d vector.
				m_textures3d.push_back(new tcu::Texture3D(texFormat, texWidth, texHeight, texDepth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFormat);
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = isCubeTex ? (int)tcu::CUBEFACE_LAST : 1;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha	= 0xff000000;

				deUint32 colorA = alpha | rgb;
				deUint32 colorB = alpha | ((~rgb) & 0x00ffffff);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2dTex)
						m_textures2d.back()->allocLevel(levelNdx);
					else if (isCubeTex)
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);
					else if (is2dArrayTex)
						m_textures2dArray.back()->allocLevel(levelNdx);
					else
						m_textures3d.back()->allocLevel(levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2dTex			? m_textures2d.back()->getLevel(levelNdx)
												  : isCubeTex		? m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face)
												  : is2dArrayTex	? m_textures2dArray.back()->getLevel(levelNdx)
												  :					  m_textures3d.back()->getLevel(levelNdx);

					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Generate information for shader.

		vector<GLenum>			unitTypes;
		vector<Vec4>			texScales;
		vector<Vec4>			texBiases;
		vector<glu::DataType>	samplerTypes;
		vector<int>				num2dArrayLayers;

		unitTypes.reserve(m_numUnits);
		texScales.reserve(m_numUnits);
		texBiases.reserve(m_numUnits);
		samplerTypes.reserve(m_numUnits);
		num2dArrayLayers.reserve(m_numUnits);

		for (int i = 0; i < m_numUnits; i++)
		{
			int						texNdx		= m_unitTextures[i];
			GLenum					type		= m_textureTypes[texNdx];
			tcu::TextureFormat		fmt			= glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat);
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(fmt);

			unitTypes.push_back(type);

			if (type == GL_TEXTURE_2D_ARRAY)
				num2dArrayLayers.push_back(m_textures2dArray[m_ndxTexType[texNdx]]->getNumLayers());

			texScales.push_back(fmtInfo.lookupScale);
			texBiases.push_back(fmtInfo.lookupBias);

			switch (type)
			{
				case GL_TEXTURE_2D:			samplerTypes.push_back(glu::getSampler2DType(fmt));			break;
				case GL_TEXTURE_CUBE_MAP:	samplerTypes.push_back(glu::getSamplerCubeType(fmt));		break;
				case GL_TEXTURE_2D_ARRAY:	samplerTypes.push_back(glu::getSampler2DArrayType(fmt));	break;
				case GL_TEXTURE_3D:			samplerTypes.push_back(glu::getSampler3DType(fmt));			break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		// Create shader.

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes, samplerTypes, texScales, texBiases, num2dArrayLayers);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}